

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::Formatter::Set<char[9]>
          (Formatter *this,string *key,char (*value) [9])

{
  mapped_type *this_00;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_58,*value,&local_59);
  std::__cxx11::string::string(local_38,local_58);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->vars_,key);
  std::__cxx11::string::operator=((string *)this_00,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void Set(const std::string& key, const T& value) {
    vars_[key] = ToString(value);
  }